

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  long lVar2;
  uchar uVar3;
  int iVar4;
  uchar *puVar5;
  long in_FS_OFFSET;
  ulong uStack_78;
  uchar decimal_point;
  size_t i;
  int length;
  double d;
  uchar *output_pointer;
  printbuffer *output_buffer_local;
  cJSON *item_local;
  double local_40;
  double test;
  uchar number_buffer [26];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = item->valuedouble;
  uVar3 = get_decimal_point();
  if (output_buffer == (printbuffer *)0x0) {
    item_local._4_4_ = 0;
  }
  else {
    if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
      i._4_4_ = sprintf((char *)&test,"null");
    }
    else {
      i._4_4_ = sprintf((char *)&test,"%1.15g",dVar1);
      iVar4 = __isoc99_sscanf(&test,"%lg",&local_40);
      if (((iVar4 != 1) || (local_40 != dVar1)) || (NAN(local_40) || NAN(dVar1))) {
        i._4_4_ = sprintf((char *)&test,"%1.17g",dVar1);
      }
    }
    if ((i._4_4_ < 0) || (0x19 < i._4_4_)) {
      item_local._4_4_ = 0;
    }
    else {
      puVar5 = ensure(output_buffer,(long)i._4_4_ + 1);
      if (puVar5 == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        for (uStack_78 = 0; uStack_78 < (ulong)(long)i._4_4_; uStack_78 = uStack_78 + 1) {
          if (number_buffer[uStack_78 - 8] == uVar3) {
            puVar5[uStack_78] = '.';
          }
          else {
            puVar5[uStack_78] = number_buffer[uStack_78 - 8];
          }
        }
        puVar5[uStack_78] = '\0';
        output_buffer->offset = (long)i._4_4_ + output_buffer->offset;
        item_local._4_4_ = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26]; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if ((d * 0) != 0)
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || ((double)test != d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}